

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O0

uint32_t blockmix_xor_save(salsa20_blk_t *Bin1,salsa20_blk_t *Bin2,salsa20_blk_t *Bout,size_t r,
                          pwxform_ctx_t *ctx)

{
  long *plVar1;
  uint32_t *puVar2;
  int *piVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  __m128i T;
  __m128i Y3_1;
  __m128i Y2_1;
  __m128i Y1_1;
  __m128i Y0_1;
  uint8_t *Stmp_1;
  __m128i s31_1;
  __m128i s30_1;
  __m128i s21_1;
  __m128i s20_1;
  __m128i s11_1;
  __m128i s10_1;
  __m128i s01_1;
  __m128i s00_1;
  uint64_t x3_1;
  uint64_t x2_1;
  uint64_t x1_1;
  uint64_t x0_1;
  uint8_t *Stmp;
  __m128i s31;
  __m128i s30;
  __m128i s21;
  __m128i s20;
  __m128i s11;
  __m128i s10;
  __m128i s01;
  __m128i s00;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t x0;
  size_t i;
  size_t w;
  uint8_t *S2;
  uint8_t *S1;
  uint8_t *S0;
  __m128i Y3;
  __m128i Y2;
  __m128i Y1;
  __m128i Y0;
  __m128i X3;
  __m128i X2;
  __m128i X1;
  __m128i X0;
  ulong local_1e00;
  ulong local_1df8;
  long local_1df0;
  long local_1de8;
  long local_1de0;
  ulong local_1d98;
  ulong uStack_1d90;
  ulong local_1d88;
  ulong uStack_1d80;
  undefined8 local_1d78;
  undefined8 uStack_1d70;
  ulong local_1d68;
  ulong uStack_1d60;
  int local_388;
  int iStack_384;
  int iStack_380;
  int iStack_37c;
  int local_368;
  int iStack_364;
  int iStack_360;
  int iStack_35c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  int local_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  __m128i T_7;
  __m128i T_6;
  __m128i T_5;
  __m128i T_4;
  __m128i T_3;
  __m128i T_2;
  __m128i T_1;
  
  local_1de0 = *in_R8;
  local_1de8 = in_R8[1];
  local_1df0 = in_R8[2];
  local_1df8 = in_R8[3];
  uVar4 = in_RCX * 2 - 1;
  for (local_1e00 = 0; local_1e00 < uVar4; local_1e00 = local_1e00 + 1) {
  }
  puVar5 = (ulong *)(in_RDI + uVar4 * 0x40);
  puVar6 = (ulong *)(in_RSI + uVar4 * 0x40);
  local_1d68 = *puVar5 ^ *puVar6;
  uStack_1d60 = puVar5[1] ^ puVar6[1];
  lVar7 = in_RDI + uVar4 * 0x40;
  lVar8 = in_RSI + uVar4 * 0x40;
  lVar9 = in_RDI + uVar4 * 0x40;
  lVar10 = in_RSI + uVar4 * 0x40;
  local_1d88 = *(ulong *)(lVar9 + 0x20) ^ *(ulong *)(lVar10 + 0x20);
  lVar11 = in_RDI + uVar4 * 0x40;
  lVar12 = in_RSI + uVar4 * 0x40;
  local_1d98 = *(ulong *)(lVar11 + 0x30) ^ *(ulong *)(lVar12 + 0x30);
  uStack_1d90 = *(ulong *)(lVar11 + 0x38) ^ *(ulong *)(lVar12 + 0x38);
  local_1e00 = 0;
  local_1d78 = *(ulong *)(lVar7 + 0x10) ^ *(ulong *)(lVar8 + 0x10);
  uStack_1d70 = *(ulong *)(lVar7 + 0x18) ^ *(ulong *)(lVar8 + 0x18);
  uStack_1d80 = *(ulong *)(lVar9 + 0x28) ^ *(ulong *)(lVar10 + 0x28);
  while( true ) {
    lVar9 = local_1de0;
    lVar8 = local_1de8;
    lVar7 = local_1df0;
    puVar5 = (ulong *)(in_RDI + local_1e00 * 0x40);
    puVar6 = (ulong *)(in_RSI + local_1e00 * 0x40);
    uVar4 = *puVar5 ^ *puVar6;
    uVar18 = puVar5[1] ^ puVar6[1];
    puVar5 = (ulong *)(in_RSI + local_1e00 * 0x40);
    *puVar5 = uVar4;
    puVar5[1] = uVar18;
    puVar5 = (ulong *)(in_RDI + 0x10 + local_1e00 * 0x40);
    puVar6 = (ulong *)(in_RSI + 0x10 + local_1e00 * 0x40);
    uVar13 = *puVar5 ^ *puVar6;
    uVar19 = puVar5[1] ^ puVar6[1];
    puVar5 = (ulong *)(in_RSI + 0x10 + local_1e00 * 0x40);
    *puVar5 = uVar13;
    puVar5[1] = uVar19;
    puVar5 = (ulong *)(in_RDI + 0x20 + local_1e00 * 0x40);
    puVar6 = (ulong *)(in_RSI + 0x20 + local_1e00 * 0x40);
    uVar14 = *puVar5 ^ *puVar6;
    uVar20 = puVar5[1] ^ puVar6[1];
    puVar5 = (ulong *)(in_RSI + 0x20 + local_1e00 * 0x40);
    *puVar5 = uVar14;
    puVar5[1] = uVar20;
    puVar5 = (ulong *)(in_RDI + 0x30 + local_1e00 * 0x40);
    puVar6 = (ulong *)(in_RSI + 0x30 + local_1e00 * 0x40);
    uVar15 = *puVar5 ^ *puVar6;
    uVar21 = puVar5[1] ^ puVar6[1];
    puVar5 = (ulong *)(in_RSI + 0x30 + local_1e00 * 0x40);
    *puVar5 = uVar15;
    puVar5[1] = uVar21;
    local_1d68 = local_1d68 ^ uVar4;
    uStack_1d60 = uStack_1d60 ^ uVar18;
    local_1d78 = local_1d78 ^ uVar13;
    uStack_1d70 = uStack_1d70 ^ uVar19;
    local_1d88 = local_1d88 ^ uVar14;
    uStack_1d80 = uStack_1d80 ^ uVar20;
    local_1d98 = local_1d98 ^ uVar15;
    uStack_1d90 = uStack_1d90 ^ uVar21;
    plVar1 = (long *)(local_1de0 + (local_1d68 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((local_1d68 & 0xff000000ff0) >> 0x20));
    uVar4 = (local_1d68 >> 0x20) * (local_1d68 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar18 = (uStack_1d60 >> 0x20) * (uStack_1d60 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (local_1d78 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((local_1d78 & 0xff000000ff0) >> 0x20));
    uVar13 = (local_1d78 >> 0x20) * (local_1d78 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar19 = (uStack_1d70 >> 0x20) * (uStack_1d70 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (local_1d88 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((local_1d88 & 0xff000000ff0) >> 0x20));
    uVar14 = (local_1d88 >> 0x20) * (local_1d88 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar20 = (uStack_1d80 >> 0x20) * (uStack_1d80 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (local_1d98 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((local_1d98 & 0xff000000ff0) >> 0x20));
    uVar15 = (local_1d98 >> 0x20) * (local_1d98 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar21 = (uStack_1d90 >> 0x20) * (uStack_1d90 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar4 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar4 & 0xff000000ff0) >> 0x20));
    uVar4 = (uVar4 >> 0x20) * (uVar4 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar18 = (uVar18 >> 0x20) * (uVar18 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar13 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar13 & 0xff000000ff0) >> 0x20));
    uVar13 = (uVar13 >> 0x20) * (uVar13 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar19 = (uVar19 >> 0x20) * (uVar19 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar14 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar14 & 0xff000000ff0) >> 0x20));
    uVar14 = (uVar14 >> 0x20) * (uVar14 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar20 = (uVar20 >> 0x20) * (uVar20 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar15 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar15 & 0xff000000ff0) >> 0x20));
    uVar15 = (uVar15 >> 0x20) * (uVar15 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar21 = (uVar21 >> 0x20) * (uVar21 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    *(ulong *)(local_1df0 + local_1df8) = uVar4;
    ((ulong *)(local_1df0 + local_1df8))[1] = uVar18;
    puVar5 = (ulong *)(local_1df0 + 0x10 + local_1df8);
    *puVar5 = uVar13;
    puVar5[1] = uVar19;
    puVar5 = (ulong *)(local_1df0 + 0x20 + local_1df8);
    *puVar5 = uVar14;
    puVar5[1] = uVar20;
    puVar5 = (ulong *)(local_1df0 + 0x30 + local_1df8);
    *puVar5 = uVar15;
    puVar5[1] = uVar21;
    lVar10 = local_1df8 + 0x40;
    plVar1 = (long *)(local_1de0 + (uVar4 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar4 & 0xff000000ff0) >> 0x20));
    uVar4 = (uVar4 >> 0x20) * (uVar4 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar18 = (uVar18 >> 0x20) * (uVar18 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar13 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar13 & 0xff000000ff0) >> 0x20));
    uVar13 = (uVar13 >> 0x20) * (uVar13 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar19 = (uVar19 >> 0x20) * (uVar19 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar14 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar14 & 0xff000000ff0) >> 0x20));
    uVar14 = (uVar14 >> 0x20) * (uVar14 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar20 = (uVar20 >> 0x20) * (uVar20 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar15 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar15 & 0xff000000ff0) >> 0x20));
    uVar15 = (uVar15 >> 0x20) * (uVar15 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar21 = (uVar21 >> 0x20) * (uVar21 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    *(ulong *)(local_1df0 + lVar10) = uVar4;
    ((ulong *)(local_1df0 + lVar10))[1] = uVar18;
    puVar5 = (ulong *)(local_1df0 + 0x10 + lVar10);
    *puVar5 = uVar13;
    puVar5[1] = uVar19;
    puVar5 = (ulong *)(local_1df0 + 0x20 + lVar10);
    *puVar5 = uVar14;
    puVar5[1] = uVar20;
    puVar5 = (ulong *)(local_1df0 + 0x30 + lVar10);
    *puVar5 = uVar15;
    puVar5[1] = uVar21;
    lVar10 = local_1df8 + 0x80;
    plVar1 = (long *)(local_1de0 + (uVar4 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar4 & 0xff000000ff0) >> 0x20));
    uVar4 = (uVar4 >> 0x20) * (uVar4 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar18 = (uVar18 >> 0x20) * (uVar18 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar13 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar13 & 0xff000000ff0) >> 0x20));
    uVar13 = (uVar13 >> 0x20) * (uVar13 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar19 = (uVar19 >> 0x20) * (uVar19 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar14 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar14 & 0xff000000ff0) >> 0x20));
    uVar14 = (uVar14 >> 0x20) * (uVar14 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar20 = (uVar20 >> 0x20) * (uVar20 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar15 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar15 & 0xff000000ff0) >> 0x20));
    uVar15 = (uVar15 >> 0x20) * (uVar15 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar21 = (uVar21 >> 0x20) * (uVar21 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    *(ulong *)(local_1df0 + lVar10) = uVar4;
    ((ulong *)(local_1df0 + lVar10))[1] = uVar18;
    puVar5 = (ulong *)(local_1df0 + 0x10 + lVar10);
    *puVar5 = uVar13;
    puVar5[1] = uVar19;
    puVar5 = (ulong *)(local_1df0 + 0x20 + lVar10);
    *puVar5 = uVar14;
    puVar5[1] = uVar20;
    puVar5 = (ulong *)(local_1df0 + 0x30 + lVar10);
    *puVar5 = uVar15;
    puVar5[1] = uVar21;
    lVar10 = local_1df8 + 0xc0;
    plVar1 = (long *)(local_1de0 + (uVar4 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar4 & 0xff000000ff0) >> 0x20));
    uVar4 = (uVar4 >> 0x20) * (uVar4 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar18 = (uVar18 >> 0x20) * (uVar18 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar13 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar13 & 0xff000000ff0) >> 0x20));
    uVar13 = (uVar13 >> 0x20) * (uVar13 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar22 = (uVar19 >> 0x20) * (uVar19 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar14 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar14 & 0xff000000ff0) >> 0x20));
    uVar14 = (uVar14 >> 0x20) * (uVar14 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar23 = (uVar20 >> 0x20) * (uVar20 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar15 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar15 & 0xff000000ff0) >> 0x20));
    uVar15 = (uVar15 >> 0x20) * (uVar15 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar24 = (uVar21 >> 0x20) * (uVar21 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    *(ulong *)(local_1df0 + lVar10) = uVar4;
    ((ulong *)(local_1df0 + lVar10))[1] = uVar18;
    puVar5 = (ulong *)(local_1df0 + 0x10 + lVar10);
    *puVar5 = uVar13;
    puVar5[1] = uVar22;
    puVar5 = (ulong *)(local_1df0 + 0x20 + lVar10);
    *puVar5 = uVar14;
    puVar5[1] = uVar23;
    puVar5 = (ulong *)(local_1df0 + 0x30 + lVar10);
    *puVar5 = uVar15;
    puVar5[1] = uVar24;
    plVar1 = (long *)(local_1de0 + (uVar4 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar4 & 0xff000000ff0) >> 0x20));
    uVar19 = (uVar4 >> 0x20) * (uVar4 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar25 = (uVar18 >> 0x20) * (uVar18 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar13 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar13 & 0xff000000ff0) >> 0x20));
    uVar20 = (uVar13 >> 0x20) * (uVar13 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar26 = (uVar22 >> 0x20) * (uVar22 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar14 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar14 & 0xff000000ff0) >> 0x20));
    uVar21 = (uVar14 >> 0x20) * (uVar14 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar27 = (uVar23 >> 0x20) * (uVar23 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1de0 + (uVar15 & 0xff0));
    puVar5 = (ulong *)(local_1de8 + ((uVar15 & 0xff000000ff0) >> 0x20));
    uVar22 = (uVar15 >> 0x20) * (uVar15 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar28 = (uVar24 >> 0x20) * (uVar24 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    uVar4 = (ulong)((int)local_1df8 + 0x100U & 0xff0);
    puVar5 = (ulong *)(in_RDX + local_1e00 * 0x40);
    *puVar5 = uVar19;
    puVar5[1] = uVar25;
    puVar5 = (ulong *)(in_RDX + 0x10 + local_1e00 * 0x40);
    *puVar5 = uVar20;
    puVar5[1] = uVar26;
    puVar5 = (ulong *)(in_RDX + 0x20 + local_1e00 * 0x40);
    *puVar5 = uVar21;
    puVar5[1] = uVar27;
    puVar5 = (ulong *)(in_RDX + 0x30 + local_1e00 * 0x40);
    *puVar5 = uVar22;
    puVar5[1] = uVar28;
    puVar5 = (ulong *)(in_RDI + 0x40 + local_1e00 * 0x40);
    puVar6 = (ulong *)(in_RSI + 0x40 + local_1e00 * 0x40);
    uVar13 = *puVar5 ^ *puVar6;
    uVar23 = puVar5[1] ^ puVar6[1];
    puVar5 = (ulong *)(local_1e00 * 0x40 + 0x40 + in_RSI);
    *puVar5 = uVar13;
    puVar5[1] = uVar23;
    puVar5 = (ulong *)(in_RDI + 0x50 + local_1e00 * 0x40);
    puVar6 = (ulong *)(in_RSI + 0x50 + local_1e00 * 0x40);
    uVar14 = *puVar5 ^ *puVar6;
    uVar24 = puVar5[1] ^ puVar6[1];
    puVar5 = (ulong *)(local_1e00 * 0x40 + 0x50 + in_RSI);
    *puVar5 = uVar14;
    puVar5[1] = uVar24;
    puVar5 = (ulong *)(in_RDI + 0x60 + local_1e00 * 0x40);
    puVar6 = (ulong *)(in_RSI + 0x60 + local_1e00 * 0x40);
    uVar15 = *puVar5 ^ *puVar6;
    uVar29 = puVar5[1] ^ puVar6[1];
    puVar5 = (ulong *)(local_1e00 * 0x40 + 0x60 + in_RSI);
    *puVar5 = uVar15;
    puVar5[1] = uVar29;
    puVar5 = (ulong *)(in_RDI + 0x70 + local_1e00 * 0x40);
    puVar6 = (ulong *)(in_RSI + 0x70 + local_1e00 * 0x40);
    uVar18 = *puVar5 ^ *puVar6;
    uVar30 = puVar5[1] ^ puVar6[1];
    puVar5 = (ulong *)(local_1e00 * 0x40 + 0x70 + in_RSI);
    *puVar5 = uVar18;
    puVar5[1] = uVar30;
    uVar19 = uVar19 ^ uVar13;
    uVar25 = uVar25 ^ uVar23;
    uVar20 = uVar20 ^ uVar14;
    uVar26 = uVar26 ^ uVar24;
    uVar21 = uVar21 ^ uVar15;
    uVar27 = uVar27 ^ uVar29;
    uVar22 = uVar22 ^ uVar18;
    uVar28 = uVar28 ^ uVar30;
    plVar1 = (long *)(local_1df0 + (uVar19 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar19 & 0xff000000ff0) >> 0x20));
    uVar13 = (uVar19 >> 0x20) * (uVar19 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar19 = (uVar25 >> 0x20) * (uVar25 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar20 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar20 & 0xff000000ff0) >> 0x20));
    uVar14 = (uVar20 >> 0x20) * (uVar20 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar20 = (uVar26 >> 0x20) * (uVar26 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar21 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar21 & 0xff000000ff0) >> 0x20));
    uVar15 = (uVar21 >> 0x20) * (uVar21 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar21 = (uVar27 >> 0x20) * (uVar27 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar22 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar22 & 0xff000000ff0) >> 0x20));
    uVar18 = (uVar22 >> 0x20) * (uVar22 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar22 = (uVar28 >> 0x20) * (uVar28 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar13 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar13 & 0xff000000ff0) >> 0x20));
    uVar13 = (uVar13 >> 0x20) * (uVar13 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar19 = (uVar19 >> 0x20) * (uVar19 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar14 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar14 & 0xff000000ff0) >> 0x20));
    uVar14 = (uVar14 >> 0x20) * (uVar14 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar20 = (uVar20 >> 0x20) * (uVar20 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar15 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar15 & 0xff000000ff0) >> 0x20));
    uVar15 = (uVar15 >> 0x20) * (uVar15 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar21 = (uVar21 >> 0x20) * (uVar21 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar18 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar18 & 0xff000000ff0) >> 0x20));
    uVar18 = (uVar18 >> 0x20) * (uVar18 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar22 = (uVar22 >> 0x20) * (uVar22 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    *(ulong *)(local_1de8 + uVar4) = uVar13;
    ((ulong *)(local_1de8 + uVar4))[1] = uVar19;
    puVar5 = (ulong *)(local_1de8 + 0x10 + uVar4);
    *puVar5 = uVar14;
    puVar5[1] = uVar20;
    puVar5 = (ulong *)(local_1de8 + 0x20 + uVar4);
    *puVar5 = uVar15;
    puVar5[1] = uVar21;
    puVar5 = (ulong *)(local_1de8 + 0x30 + uVar4);
    *puVar5 = uVar18;
    puVar5[1] = uVar22;
    lVar10 = uVar4 + 0x40;
    plVar1 = (long *)(local_1df0 + (uVar13 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar13 & 0xff000000ff0) >> 0x20));
    uVar13 = (uVar13 >> 0x20) * (uVar13 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar19 = (uVar19 >> 0x20) * (uVar19 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar14 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar14 & 0xff000000ff0) >> 0x20));
    uVar14 = (uVar14 >> 0x20) * (uVar14 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar20 = (uVar20 >> 0x20) * (uVar20 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar15 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar15 & 0xff000000ff0) >> 0x20));
    uVar15 = (uVar15 >> 0x20) * (uVar15 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar21 = (uVar21 >> 0x20) * (uVar21 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar18 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar18 & 0xff000000ff0) >> 0x20));
    uVar18 = (uVar18 >> 0x20) * (uVar18 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar22 = (uVar22 >> 0x20) * (uVar22 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    *(ulong *)(local_1de8 + lVar10) = uVar13;
    ((ulong *)(local_1de8 + lVar10))[1] = uVar19;
    puVar5 = (ulong *)(local_1de8 + 0x10 + lVar10);
    *puVar5 = uVar14;
    puVar5[1] = uVar20;
    puVar5 = (ulong *)(local_1de8 + 0x20 + lVar10);
    *puVar5 = uVar15;
    puVar5[1] = uVar21;
    puVar5 = (ulong *)(local_1de8 + 0x30 + lVar10);
    *puVar5 = uVar18;
    puVar5[1] = uVar22;
    lVar10 = uVar4 + 0x80;
    plVar1 = (long *)(local_1df0 + (uVar13 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar13 & 0xff000000ff0) >> 0x20));
    uVar13 = (uVar13 >> 0x20) * (uVar13 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar19 = (uVar19 >> 0x20) * (uVar19 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar14 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar14 & 0xff000000ff0) >> 0x20));
    uVar14 = (uVar14 >> 0x20) * (uVar14 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar20 = (uVar20 >> 0x20) * (uVar20 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar15 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar15 & 0xff000000ff0) >> 0x20));
    uVar15 = (uVar15 >> 0x20) * (uVar15 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar21 = (uVar21 >> 0x20) * (uVar21 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar18 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar18 & 0xff000000ff0) >> 0x20));
    uVar18 = (uVar18 >> 0x20) * (uVar18 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar22 = (uVar22 >> 0x20) * (uVar22 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    *(ulong *)(local_1de8 + lVar10) = uVar13;
    ((ulong *)(local_1de8 + lVar10))[1] = uVar19;
    puVar5 = (ulong *)(local_1de8 + 0x10 + lVar10);
    *puVar5 = uVar14;
    puVar5[1] = uVar20;
    puVar5 = (ulong *)(local_1de8 + 0x20 + lVar10);
    *puVar5 = uVar15;
    puVar5[1] = uVar21;
    puVar5 = (ulong *)(local_1de8 + 0x30 + lVar10);
    *puVar5 = uVar18;
    puVar5[1] = uVar22;
    lVar10 = uVar4 + 0xc0;
    plVar1 = (long *)(local_1df0 + (uVar13 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar13 & 0xff000000ff0) >> 0x20));
    uVar13 = (uVar13 >> 0x20) * (uVar13 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar19 = (uVar19 >> 0x20) * (uVar19 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar14 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar14 & 0xff000000ff0) >> 0x20));
    uVar14 = (uVar14 >> 0x20) * (uVar14 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar20 = (uVar20 >> 0x20) * (uVar20 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar15 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar15 & 0xff000000ff0) >> 0x20));
    uVar15 = (uVar15 >> 0x20) * (uVar15 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar21 = (uVar21 >> 0x20) * (uVar21 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar18 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar18 & 0xff000000ff0) >> 0x20));
    uVar18 = (uVar18 >> 0x20) * (uVar18 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar22 = (uVar22 >> 0x20) * (uVar22 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    *(ulong *)(local_1de8 + lVar10) = uVar13;
    ((ulong *)(local_1de8 + lVar10))[1] = uVar19;
    puVar5 = (ulong *)(local_1de8 + 0x10 + lVar10);
    *puVar5 = uVar14;
    puVar5[1] = uVar20;
    puVar5 = (ulong *)(local_1de8 + 0x20 + lVar10);
    *puVar5 = uVar15;
    puVar5[1] = uVar21;
    puVar5 = (ulong *)(local_1de8 + 0x30 + lVar10);
    *puVar5 = uVar18;
    puVar5[1] = uVar22;
    plVar1 = (long *)(local_1df0 + (uVar13 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar13 & 0xff000000ff0) >> 0x20));
    local_1d68 = (uVar13 >> 0x20) * (uVar13 & 0xffffffff) + *plVar1 ^ *puVar5;
    uStack_1d60 = (uVar19 >> 0x20) * (uVar19 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar14 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar14 & 0xff000000ff0) >> 0x20));
    uVar13 = (uVar14 >> 0x20) * (uVar14 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar14 = (uVar20 >> 0x20) * (uVar20 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar15 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar15 & 0xff000000ff0) >> 0x20));
    local_1d88 = (uVar15 >> 0x20) * (uVar15 & 0xffffffff) + *plVar1 ^ *puVar5;
    uVar15 = (uVar21 >> 0x20) * (uVar21 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    plVar1 = (long *)(local_1df0 + (uVar18 & 0xff0));
    puVar5 = (ulong *)(local_1de0 + ((uVar18 & 0xff000000ff0) >> 0x20));
    local_1d98 = (uVar18 >> 0x20) * (uVar18 & 0xffffffff) + *plVar1 ^ *puVar5;
    uStack_1d90 = (uVar22 >> 0x20) * (uVar22 & 0xffffffff) + plVar1[1] ^ puVar5[1];
    local_1df8 = uVar4 + 0x100 & 0xff0;
    local_1df0 = local_1de0;
    local_1de8 = lVar7;
    local_1de0 = lVar8;
    if (in_RCX * 2 - 2U <= local_1e00) break;
    puVar5 = (ulong *)(in_RDX + (local_1e00 + 1) * 0x40);
    *puVar5 = local_1d68;
    puVar5[1] = uStack_1d60;
    lVar7 = in_RDX + (local_1e00 + 1) * 0x40;
    *(ulong *)(lVar7 + 0x10) = uVar13;
    *(ulong *)(lVar7 + 0x18) = uVar14;
    lVar7 = in_RDX + (local_1e00 + 1) * 0x40;
    *(ulong *)(lVar7 + 0x20) = local_1d88;
    *(ulong *)(lVar7 + 0x28) = uVar15;
    lVar7 = in_RDX + (local_1e00 + 1) * 0x40;
    *(ulong *)(lVar7 + 0x30) = local_1d98;
    *(ulong *)(lVar7 + 0x38) = uStack_1d90;
    local_1e00 = local_1e00 + 2;
    local_1d78 = uVar13;
    uStack_1d70 = uVar14;
    uStack_1d80 = uVar15;
  }
  lVar10 = local_1e00 + 1;
  *in_R8 = lVar8;
  in_R8[1] = lVar7;
  in_R8[2] = lVar9;
  in_R8[3] = local_1df8;
  local_238 = (int)local_1d68;
  iStack_234 = (int)(local_1d68 >> 0x20);
  iStack_230 = (int)uStack_1d60;
  iStack_22c = (int)(uStack_1d60 >> 0x20);
  local_248 = (int)local_1d98;
  iStack_244 = (int)(local_1d98 >> 0x20);
  iStack_240 = (int)uStack_1d90;
  iStack_23c = (int)(uStack_1d90 >> 0x20);
  uVar4 = uVar13 ^ CONCAT44(iStack_234 + iStack_244,(local_238 + local_248) * 0x80) ^
          CONCAT44((uint)(iStack_234 + iStack_244) >> 0x19,(uint)(local_238 + local_248) >> 0x19);
  uVar18 = uVar14 ^ CONCAT44(iStack_22c + iStack_23c,iStack_230 + iStack_240) ^
           CONCAT44((uint)(iStack_22c + iStack_23c) >> 0x19,(uint)(iStack_230 + iStack_240) >> 0x19)
  ;
  local_258 = (int)uVar4;
  iStack_254 = (int)(uVar4 >> 0x20);
  iStack_250 = (int)uVar18;
  iStack_24c = (int)(uVar18 >> 0x20);
  uVar4 = local_1d88 ^ CONCAT44(iStack_254 + iStack_234,(local_258 + local_238) * 0x200) ^
          CONCAT44((uint)(iStack_254 + iStack_234) >> 0x17,(uint)(local_258 + local_238) >> 0x17);
  uVar19 = uVar15 ^ CONCAT44(iStack_24c + iStack_22c,iStack_250 + iStack_230) ^
           CONCAT44((uint)(iStack_24c + iStack_22c) >> 0x17,(uint)(iStack_250 + iStack_230) >> 0x17)
  ;
  local_278 = (int)uVar4;
  iStack_274 = (int)(uVar4 >> 0x20);
  iStack_270 = (int)uVar19;
  iStack_26c = (int)(uVar19 >> 0x20);
  local_1d98 = local_1d98 ^ CONCAT44(iStack_274 + iStack_254,(local_278 + local_258) * 0x2000) ^
               CONCAT44((uint)(iStack_274 + iStack_254) >> 0x13,
                        (uint)(local_278 + local_258) >> 0x13);
  uStack_1d90 = uStack_1d90 ^ CONCAT44(iStack_26c + iStack_24c,iStack_270 + iStack_250) ^
                CONCAT44((uint)(iStack_26c + iStack_24c) >> 0x13,
                         (uint)(iStack_270 + iStack_250) >> 0x13);
  local_298 = (int)local_1d98;
  iStack_294 = (int)(local_1d98 >> 0x20);
  iStack_290 = (int)uStack_1d90;
  iStack_28c = (int)(uStack_1d90 >> 0x20);
  uVar4 = local_1d68 ^ CONCAT44(iStack_294 + iStack_274,(local_298 + local_278) * 0x40000) ^
          CONCAT44((uint)(iStack_294 + iStack_274) >> 0xe,(uint)(local_298 + local_278) >> 0xe);
  uVar20 = uStack_1d60 ^ CONCAT44(iStack_28c + iStack_26c,iStack_290 + iStack_270) ^
           CONCAT44((uint)(iStack_28c + iStack_26c) >> 0xe,(uint)(iStack_290 + iStack_270) >> 0xe);
  local_1d78 = CONCAT44(local_258,iStack_24c);
  uStack_1d70._0_4_ = iStack_254;
  uStack_1d70._4_4_ = iStack_250;
  auVar16._8_4_ = local_278;
  auVar16._0_8_ = uVar19;
  auVar16._12_4_ = iStack_274;
  auVar17._0_12_ = local_1d98._4_12_;
  auVar17._12_4_ = local_298;
  local_2b8 = (int)uVar4;
  iStack_2b4 = (int)(uVar4 >> 0x20);
  iStack_2b0 = (int)uVar20;
  iStack_2ac = (int)(uVar20 >> 0x20);
  local_1d98 = local_1d98._4_8_;
  uStack_1d90 = auVar17._8_8_;
  uVar18 = local_1d98 ^ CONCAT44(iStack_2b4 + local_258,(local_2b8 + iStack_24c) * 0x80) ^
           CONCAT44((uint)(iStack_2b4 + local_258) >> 0x19,(uint)(local_2b8 + iStack_24c) >> 0x19);
  uVar21 = uStack_1d90 ^ CONCAT44(iStack_2ac + iStack_250,iStack_2b0 + iStack_254) ^
           CONCAT44((uint)(iStack_2ac + iStack_250) >> 0x19,(uint)(iStack_2b0 + iStack_254) >> 0x19)
  ;
  local_2d8 = (int)uVar18;
  iStack_2d4 = (int)(uVar18 >> 0x20);
  iStack_2d0 = (int)uVar21;
  iStack_2cc = (int)(uVar21 >> 0x20);
  uStack_1d80 = auVar16._8_8_;
  uVar18 = uVar19 ^ CONCAT44(iStack_2d4 + iStack_2b4,(local_2d8 + local_2b8) * 0x200) ^
           CONCAT44((uint)(iStack_2d4 + iStack_2b4) >> 0x17,(uint)(local_2d8 + local_2b8) >> 0x17);
  uVar19 = uStack_1d80 ^ CONCAT44(iStack_2cc + iStack_2ac,iStack_2d0 + iStack_2b0) ^
           CONCAT44((uint)(iStack_2cc + iStack_2ac) >> 0x17,(uint)(iStack_2d0 + iStack_2b0) >> 0x17)
  ;
  local_2f8 = (int)uVar18;
  iStack_2f4 = (int)(uVar18 >> 0x20);
  iStack_2f0 = (int)uVar19;
  iStack_2ec = (int)(uVar19 >> 0x20);
  uVar18 = local_1d78 ^ CONCAT44(iStack_2f4 + iStack_2d4,(local_2f8 + local_2d8) * 0x2000) ^
           CONCAT44((uint)(iStack_2f4 + iStack_2d4) >> 0x13,(uint)(local_2f8 + local_2d8) >> 0x13);
  uVar19 = uStack_1d70 ^ CONCAT44(iStack_2ec + iStack_2cc,iStack_2f0 + iStack_2d0) ^
           CONCAT44((uint)(iStack_2ec + iStack_2cc) >> 0x13,(uint)(iStack_2f0 + iStack_2d0) >> 0x13)
  ;
  local_318 = (int)uVar18;
  iStack_314 = (int)(uVar18 >> 0x20);
  iStack_310 = (int)uVar19;
  iStack_30c = (int)(uVar19 >> 0x20);
  uVar4 = uVar4 ^ CONCAT44(iStack_314 + iStack_2f4,(local_318 + local_2f8) * 0x40000) ^
          CONCAT44((uint)(iStack_314 + iStack_2f4) >> 0xe,(uint)(local_318 + local_2f8) >> 0xe);
  uVar18 = uVar20 ^ CONCAT44(iStack_30c + iStack_2ec,iStack_310 + iStack_2f0) ^
           CONCAT44((uint)(iStack_30c + iStack_2ec) >> 0xe,(uint)(iStack_310 + iStack_2f0) >> 0xe);
  local_338 = (int)uVar4;
  iStack_334 = (int)(uVar4 >> 0x20);
  iStack_330 = (int)uVar18;
  iStack_32c = (int)(uVar18 >> 0x20);
  puVar2 = (uint32_t *)(in_RDX + lVar10 * 0x40);
  *puVar2 = local_338 + local_238;
  puVar2[1] = iStack_334 + iStack_234;
  puVar2[2] = iStack_330 + iStack_230;
  puVar2[3] = iStack_32c + iStack_22c;
  local_368 = (int)uVar13;
  iStack_364 = (int)(uVar13 >> 0x20);
  iStack_360 = (int)uVar14;
  iStack_35c = (int)(uVar14 >> 0x20);
  piVar3 = (int *)(in_RDX + 0x10 + lVar10 * 0x40);
  *piVar3 = iStack_314 + local_368;
  piVar3[1] = iStack_310 + iStack_364;
  piVar3[2] = iStack_30c + iStack_360;
  piVar3[3] = local_318 + iStack_35c;
  local_388 = (int)local_1d88;
  iStack_384 = (int)(local_1d88 >> 0x20);
  iStack_380 = (int)uVar15;
  iStack_37c = (int)(uVar15 >> 0x20);
  piVar3 = (int *)(in_RDX + 0x20 + lVar10 * 0x40);
  *piVar3 = iStack_2f0 + local_388;
  piVar3[1] = iStack_2ec + iStack_384;
  piVar3[2] = local_2f8 + iStack_380;
  piVar3[3] = iStack_2f4 + iStack_37c;
  piVar3 = (int *)(in_RDX + 0x30 + lVar10 * 0x40);
  *piVar3 = iStack_2cc + local_248;
  piVar3[1] = local_2d8 + iStack_244;
  piVar3[2] = iStack_2d4 + iStack_240;
  piVar3[3] = iStack_2d0 + iStack_23c;
  return local_338 + local_238;
}

Assistant:

static uint32_t
blockmix_xor_save(const salsa20_blk_t *restrict Bin1,
    salsa20_blk_t *restrict Bin2, salsa20_blk_t *restrict Bout,
    size_t r, pwxform_ctx_t *restrict ctx)
{
	__m128i X0, X1, X2, X3, Y0, Y1, Y2, Y3;
	uint8_t *S0 = ctx->S0, *S1 = ctx->S1, *S2 = ctx->S2;
	size_t w = ctx->w;
	size_t i;

	/* Convert 128-byte blocks to 64-byte blocks */
	/* 1: r_1 <-- 128r / PWXbytes */
	r *= 2;

	r--;
	PREFETCH(&Bin2[r], _MM_HINT_T0)
	PREFETCH(&Bin1[r], _MM_HINT_T0)
	for (i = 0; i < r; i++) {
		PREFETCH(&Bin2[i], _MM_HINT_T0)
		PREFETCH(&Bin1[i], _MM_HINT_T0)
	}

	/* 2: X <-- B'_{r_1 - 1} */
	XOR4_2(Bin1[r].q, Bin2[r].q)

	/* 3: for i = 0 to r_1 - 1 do */
	i = 0;
	r--;
	do {
		XOR4(Bin1[i].q, Bin2[i].q)
		/* 5: X <-- X \xor B'_i */
		XOR4_Y
		/* 7: X <-- pwxform(X) */
		PWXFORM
		/* 8: B'_i <-- X */
		OUT(Bout[i].q)

		XOR4(Bin1[i + 1].q, Bin2[i + 1].q)
		/* 5: X <-- X \xor B'_i */
		XOR4_Y
		/* 7: X <-- pwxform(X) */
		PWXFORM

		if (unlikely(i >= r))
			break;

		/* 8: B'_i <-- X */
		OUT(Bout[i + 1].q)

		i += 2;
	} while (1);
	i++;

	ctx->S0 = S0; ctx->S1 = S1; ctx->S2 = S2;
	ctx->w = w;

	/* 11: B_i <-- H(B_i) */
	SALSA20_2(Bout[i].q)

	return _mm_cvtsi128_si32(X0);
}